

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_7uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar8 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      bVar1 = *pSrc;
      bVar2 = pSrc[1];
      bVar3 = pSrc[2];
      bVar4 = pSrc[3];
      bVar5 = pSrc[4];
      bVar6 = pSrc[5];
      bVar7 = pSrc[6];
      pSrc = pSrc + 7;
      pDst[uVar8] = (uint)(bVar1 >> 1);
      pDst[uVar8 + 1] = (uint)(bVar2 >> 2) | (bVar1 & 1) << 6;
      pDst[uVar8 + 2] = (uint)(bVar3 >> 3) | (bVar2 & 3) << 5;
      pDst[uVar8 + 3] = (uint)(bVar4 >> 4) | (bVar3 & 7) << 4;
      pDst[uVar8 + 4] = (uint)(bVar5 >> 5) + (bVar4 & 0xf) * 8;
      pDst[uVar8 + 5] = (uint)(bVar6 >> 6) + (bVar5 & 0x1f) * 4;
      pDst[uVar8 + 6] = (uint)(bVar7 >> 7) + (bVar6 & 0x3f) * 2;
      pDst[uVar8 + 7] = bVar7 & 0x7f;
      uVar8 = uVar8 + 8;
    } while (uVar8 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    bVar1 = *pSrc;
    pDst[uVar8] = (uint)(bVar1 >> 1);
    uVar9 = (uint)(length & 7);
    if (uVar9 != 1) {
      bVar2 = pSrc[1];
      pDst[uVar8 + 1] = (uint)(bVar2 >> 2) | (bVar1 & 1) << 6;
      if (2 < uVar9) {
        bVar1 = pSrc[2];
        pDst[uVar8 + 2] = (uint)(bVar1 >> 3) | (bVar2 & 3) << 5;
        if (uVar9 != 3) {
          bVar2 = pSrc[3];
          pDst[uVar8 + 3] = (uint)(bVar2 >> 4) | (bVar1 & 7) << 4;
          if (4 < uVar9) {
            bVar1 = pSrc[4];
            pDst[uVar8 + 4] = (uint)(bVar1 >> 5) + (bVar2 & 0xf) * 8;
            if (uVar9 != 5) {
              bVar2 = pSrc[5];
              pDst[uVar8 + 5] = (uint)(bVar2 >> 6) + (bVar1 & 0x1f) * 4;
              if (uVar9 == 7) {
                pDst[uVar8 + 6] = (uint)(pSrc[6] >> 7) + (bVar2 & 0x3f) * 2;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_7uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		OPJ_UINT32 val3 = *pSrc++;
		OPJ_UINT32 val4 = *pSrc++;
		OPJ_UINT32 val5 = *pSrc++;
		OPJ_UINT32 val6 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 >> 1));
		pDst[i+1] = (OPJ_INT32)(((val0 & 0x1U) << 6) | (val1 >> 2));
		pDst[i+2] = (OPJ_INT32)(((val1 & 0x3U) << 5) | (val2 >> 3));
		pDst[i+3] = (OPJ_INT32)(((val2 & 0x7U) << 4) | (val3 >> 4));
		pDst[i+4] = (OPJ_INT32)(((val3 & 0xFU) << 3) | (val4 >> 5));
		pDst[i+5] = (OPJ_INT32)(((val4 & 0x1FU) << 2) | (val5 >> 6));
		pDst[i+6] = (OPJ_INT32)(((val5 & 0x3FU) << 1) | (val6 >> 7));
		pDst[i+7] = (OPJ_INT32)(((val6 & 0x7FU)));
		
	}
	if (length & 7U) {
		unsigned int val;
		int available = 0;
		
		length = length & 7U;
		
		GETBITS(pDst[i+0], 7)
		
		if (length > 1U) {
			GETBITS(pDst[i+1], 7)
			if (length > 2U) {
				GETBITS(pDst[i+2], 7)
				if (length > 3U) {
					GETBITS(pDst[i+3], 7)
					if (length > 4U) {
						GETBITS(pDst[i+4], 7)
						if (length > 5U) {
							GETBITS(pDst[i+5], 7)
							if (length > 6U) {
								GETBITS(pDst[i+6], 7)
							}
						}
					}
				}
			}
		}
	}
}